

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall
Hpipe::Instruction::apply(Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  undefined7 in_register_00000011;
  function<void_(Hpipe::Instruction_*)> fStack_38;
  
  cur_op_id = cur_op_id + 1;
  std::function<void_(Hpipe::Instruction_*)>::function(&fStack_38,f);
  (*this->_vptr_Instruction[6])
            (this,&fStack_38,CONCAT71(in_register_00000011,subgraphs) & 0xffffffff);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

void Instruction::apply( std::function<void (Instruction *)> f, bool subgraphs ) {
    ++cur_op_id;
    apply_rec( f, subgraphs );
}